

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  deUint32 *this_00;
  CoordType CVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int y;
  int width;
  int height;
  RenderContext *context;
  TextureCube *pTVar4;
  ConstPixelBufferAccess *pCVar5;
  TestLog *pTVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ConstPixelBufferAccess *pCVar9;
  ConstPixelBufferAccess *pCVar10;
  ConstPixelBufferAccess *pCVar11;
  ConstPixelBufferAccess *pCVar12;
  bool bVar13;
  int iVar14;
  deUint32 dVar15;
  int iVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  NotSupportedError *this_01;
  Surface *pSVar19;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  ulong uVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  RandomViewport viewport;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_450 [40];
  Surface renderedFrame;
  undefined1 local_410 [40];
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_3d0 [40];
  undefined1 local_3a8 [44];
  LodPrecision lodPrec;
  Surface referenceFrame;
  Surface errorMask;
  LookupPrecision local_338;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f8;
  float fStack_2e8;
  undefined1 auStack_2e4 [24];
  float afStack_2cc [15];
  ios_base local_290 [264];
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [6];
  ReferenceParams local_ec;
  PixelBufferAccess local_58;
  
  iVar16 = (this->m_texture->m_refTexture).m_size * 2;
  iVar14 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar21 = CONCAT44(extraout_var,iVar14);
  iVar14 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar15 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar14),iVar16,iVar16,dVar15);
  CVar1 = this->m_coordType;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  if ((iVar16 >> 1 <= viewport.width) && (iVar16 >> 1 <= viewport.height)) {
    glu::TextureCube::upload(this->m_texture);
    (**(code **)(lVar21 + 0xb8))(0x8513,this->m_texture->m_glTexture);
    (**(code **)(lVar21 + 0x1360))(0x8513,0x2802,this->m_wrapS);
    (**(code **)(lVar21 + 0x1360))(0x8513,0x2803,this->m_wrapT);
    (**(code **)(lVar21 + 0x1360))(0x8513,0x2801,this->m_minFilter);
    (**(code **)(lVar21 + 0x1360))(0x8513,0x2800,0x2600);
    dVar15 = (**(code **)(lVar21 + 0x800))();
    glu::checkError(dVar15,"After texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x265);
    iVar14 = viewport.height;
    iVar16 = viewport.width;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deRandom_init(&rnd.m_rnd,7);
    randomPartition(&gridLayout,&rnd,0,0,iVar16,iVar14);
    if (iterate()::s_projections == '\0') {
      iterate();
    }
    if (0 < (int)((ulong)((long)gridLayout.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      lVar23 = 0xc;
      uVar20 = 0;
      do {
        uVar24 = (uint)uVar20;
        iVar16 = *(int *)((long)(gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + -0xc)
        ;
        iVar14 = *(int *)((long)(gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + -8);
        uVar2 = *(undefined4 *)
                 ((long)(gridLayout.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + -4);
        uVar3 = *(undefined4 *)
                 ((long)(gridLayout.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23);
        rnd.m_rnd.x = 1;
        rnd.m_rnd.y = 0;
        rnd.m_rnd.z = 0;
        rnd.m_rnd.w = 0x3f800000;
        aStack_2f8._M_allocated_capacity._0_4_ = 1.0;
        aStack_2f8._M_allocated_capacity._4_4_ = 1.0;
        aStack_2f8._8_4_ = 1.0;
        aStack_2f8._12_4_ = 0.0;
        fStack_2e8 = 0.0;
        auStack_2e4._0_4_ = 1.0;
        auStack_2e4._4_4_ = 1.0;
        auStack_2e4._8_4_ = 1.0;
        auStack_2e4._12_4_ = 1.0;
        auStack_2e4._16_4_ = 0.0;
        auStack_2e4._20_4_ = 0.0;
        afStack_2cc[0] = 0.0;
        afStack_2cc[1] = 0.0;
        glu::TextureTestUtil::computeQuadTexCoordCube
                  (&texCoord,uVar24 + (int)((uVar20 & 0xffffffff) / 6) * -6);
        if (CVar1 == COORDTYPE_PROJECTED) {
          rnd.m_rnd.z = rnd.m_rnd.z | 1;
          uVar18 = (ulong)((uVar24 & 3) << 4);
          uVar7 = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar18);
          uVar8 = *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar18 + 8);
          rnd.m_rnd.w = (deUint32)uVar7;
          aStack_2f8._M_allocated_capacity._0_4_ = (undefined4)((ulong)uVar7 >> 0x20);
          aStack_2f8._M_allocated_capacity._4_4_ = (undefined4)uVar8;
          aStack_2f8._8_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        }
        else if (CVar1 == COORDTYPE_BASIC_BIAS) {
          rnd.m_rnd.z = rnd.m_rnd.z | 2;
          aStack_2f8._12_4_ = Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar24 & 7];
        }
        (**(code **)(lVar21 + 0x1a00))(iVar16 + viewport.x,iVar14 + viewport.y,uVar2,uVar3);
        deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                  (&this->m_renderer,0,
                   texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,(RenderParams *)&rnd);
        uVar20 = uVar20 + 1;
        lVar23 = lVar23 + 0x10;
      } while ((long)uVar20 <
               (long)(int)((ulong)((long)gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)gridLayout.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    dVar15 = (**(code **)(lVar21 + 0x800))();
    glu::checkError(dVar15,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x294);
    context = this->m_renderCtx;
    local_ec.super_RenderParams.texType = TEXTURETYPE_LAST;
    local_ec.super_RenderParams.samplerType = SAMPLERTYPE_SHADOW;
    pvVar22 = (void *)renderedFrame.m_pixels.m_cap;
    if (renderedFrame.m_pixels.m_cap != 0) {
      pvVar22 = renderedFrame.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&rnd,(TextureFormat *)&local_ec,renderedFrame.m_width,
               renderedFrame.m_height,1,pvVar22);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&rnd);
    dVar15 = (**(code **)(lVar21 + 0x800))();
    glu::checkError(dVar15,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                    ,0x298);
    tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
    tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
    glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_ec,TEXTURETYPE_CUBE);
    local_338.coordBits.m_data[0] = 0x16;
    local_338.coordBits.m_data[1] = 0x16;
    local_338.coordBits.m_data[2] = 0x16;
    local_338.uvwBits.m_data[0] = 0x10;
    local_338.uvwBits.m_data[1] = 0x10;
    local_338.uvwBits.m_data[2] = 0x10;
    local_338.colorThreshold.m_data[0] = 0.0;
    local_338.colorThreshold.m_data[1] = 0.0;
    local_338.colorThreshold.m_data[2] = 0.0;
    local_338.colorThreshold.m_data[3] = 0.0;
    local_338.colorMask.m_data[0] = true;
    local_338.colorMask.m_data[1] = true;
    local_338.colorMask.m_data[2] = true;
    local_338.colorMask.m_data[3] = true;
    lodPrec.rule = RULE_OPENGL;
    lodPrec.derivateBits = 0x16;
    lodPrec.lodBits = 0x10;
    glu::mapGLSampler((Sampler *)&rnd,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
    local_ec.sampler.compareChannel = (int)fStack_2e8;
    local_ec.sampler.minFilter = rnd.m_rnd.w;
    local_ec.sampler.wrapR = rnd.m_rnd.z;
    local_ec.sampler.lodThreshold = (float)aStack_2f8._M_allocated_capacity._4_4_;
    local_ec.sampler.magFilter = aStack_2f8._M_allocated_capacity._0_4_;
    local_ec.sampler.compare = aStack_2f8._12_4_;
    local_ec.sampler._24_4_ = aStack_2f8._8_4_;
    local_ec.sampler.wrapS = rnd.m_rnd.x;
    local_ec.sampler.wrapT = rnd.m_rnd.y;
    local_ec.sampler.borderColor.v._0_8_ = CONCAT44(auStack_2e4._4_4_,auStack_2e4._0_4_);
    local_ec.sampler.borderColor.v._8_8_ = CONCAT44(auStack_2e4._12_4_,auStack_2e4._8_4_);
    local_ec.sampler._52_8_ = CONCAT44(auStack_2e4._20_4_,auStack_2e4._16_4_) & 0xffffffffffffff00;
    local_ec.lodMode = LODMODE_EXACT;
    iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    lVar21 = CONCAT44(extraout_var_01,iVar16);
    local_338.colorMask.m_data[1] = 0 < *(int *)(lVar21 + 0xc);
    local_338.colorMask.m_data[0] = 0 < *(int *)(lVar21 + 8);
    local_338.colorMask.m_data[2] = 0 < *(int *)(lVar21 + 0x10);
    local_338.colorMask.m_data[3] = 0 < *(int *)(lVar21 + 0x14);
    iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    lVar21 = CONCAT44(extraout_var_02,iVar16);
    uVar24 = *(int *)(lVar21 + 8) - 2;
    uVar25 = *(int *)(lVar21 + 0xc) - 2;
    uVar26 = *(int *)(lVar21 + 0x10) - 2;
    uVar27 = *(int *)(lVar21 + 0x14) - 2;
    res.m_data[0] = -(uint)(0 < (int)uVar24) & uVar24;
    res.m_data[1] = -(uint)(0 < (int)uVar25) & uVar25;
    res.m_data[2] = -(uint)(0 < (int)uVar26) & uVar26;
    res.m_data[3] = -(uint)(0 < (int)uVar27) & uVar27;
    tcu::computeFixedPointThreshold((tcu *)&rnd,&res);
    local_338.colorThreshold.m_data[3] = (float)rnd.m_rnd.w;
    local_338.colorThreshold.m_data[2] = (float)rnd.m_rnd.z;
    local_338.colorThreshold.m_data[0] = (float)rnd.m_rnd.x;
    local_338.colorThreshold.m_data[1] = (float)rnd.m_rnd.y;
    local_338.coordBits.m_data[2] = (uint)(CVar1 != COORDTYPE_PROJECTED) * 2 + 8;
    lodPrec.lodBits = (uint)(CVar1 != COORDTYPE_PROJECTED) * 2 + 4;
    local_338.coordBits.m_data[1] = local_338.coordBits.m_data[2];
    local_338.coordBits.m_data[0] = local_338.coordBits.m_data[2];
    local_338.uvwBits.m_data[0] = 5;
    local_338.uvwBits.m_data[1] = 5;
    local_338.uvwBits.m_data[2] = 0;
    lodPrec.derivateBits = 10;
    if ((int)((ulong)((long)gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)gridLayout.
                           super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
      bVar13 = false;
      iVar16 = 0;
    }
    else {
      uVar20 = 0;
      lVar21 = 0xc;
      iVar16 = 0;
      do {
        uVar24 = (uint)uVar20;
        iVar14 = *(int *)((long)(gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar21 + -0xc)
        ;
        y = *(int *)((long)(gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar21 + -8);
        width = *(int *)((long)(gridLayout.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar21 + -4);
        height = *(int *)((long)(gridLayout.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar21);
        glu::TextureTestUtil::computeQuadTexCoordCube
                  (&texCoord,uVar24 + (int)((uVar20 & 0xffffffff) / 6) * -6);
        if (CVar1 == COORDTYPE_PROJECTED) {
          local_ec.super_RenderParams.flags._0_1_ = (byte)local_ec.super_RenderParams.flags | 1;
          uVar18 = (ulong)((uVar24 & 3) << 4);
          local_ec.super_RenderParams.w.m_data._0_8_ =
               *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar18);
          local_ec.super_RenderParams.w.m_data._8_8_ =
               *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar18 + 8);
        }
        else if (CVar1 == COORDTYPE_BASIC_BIAS) {
          local_ec.super_RenderParams.flags._0_1_ = (byte)local_ec.super_RenderParams.flags | 2;
          local_ec.super_RenderParams.bias =
               Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar24 & 7];
        }
        iVar17 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        tcu::SurfaceAccess::SurfaceAccess
                  ((SurfaceAccess *)&res,&referenceFrame,
                   (PixelFormat *)(CONCAT44(extraout_var_03,iVar17) + 8),iVar14,y,width,height);
        pTVar4 = this->m_texture;
        pCVar5 = (pTVar4->m_refTexture).m_view.m_levels[5];
        auStack_2e4._12_4_ = SUB84(pCVar5,0);
        auStack_2e4._16_4_ = (undefined4)((ulong)pCVar5 >> 0x20);
        rnd.m_rnd.x = (pTVar4->m_refTexture).m_view.m_numLevels;
        rnd.m_rnd.y = *(deUint32 *)&(pTVar4->m_refTexture).m_view.field_0x4;
        pCVar5 = (pTVar4->m_refTexture).m_view.m_levels[0];
        pCVar9 = (pTVar4->m_refTexture).m_view.m_levels[1];
        pCVar10 = (pTVar4->m_refTexture).m_view.m_levels[2];
        pCVar11 = (pTVar4->m_refTexture).m_view.m_levels[3];
        pCVar12 = (pTVar4->m_refTexture).m_view.m_levels[4];
        fStack_2e8 = SUB84(pCVar11,0);
        auStack_2e4._0_4_ = (undefined4)((ulong)pCVar11 >> 0x20);
        auStack_2e4._4_4_ = SUB84(pCVar12,0);
        auStack_2e4._8_4_ = (undefined4)((ulong)pCVar12 >> 0x20);
        aStack_2f8._M_allocated_capacity._0_4_ = SUB84(pCVar9,0);
        aStack_2f8._M_allocated_capacity._4_4_ = (undefined4)((ulong)pCVar9 >> 0x20);
        aStack_2f8._8_4_ = SUB84(pCVar10,0);
        aStack_2f8._12_4_ = (undefined4)((ulong)pCVar10 >> 0x20);
        rnd.m_rnd.z = (deUint32)pCVar5;
        rnd.m_rnd.w = (deUint32)((ulong)pCVar5 >> 0x20);
        glu::TextureTestUtil::sampleTexture
                  ((SurfaceAccess *)&res,(TextureCubeView *)&rnd,
                   texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_ec);
        rnd.m_rnd.x = 8;
        rnd.m_rnd.y = 3;
        pvVar22 = (void *)renderedFrame.m_pixels.m_cap;
        if (renderedFrame.m_pixels.m_cap != 0) {
          pvVar22 = renderedFrame.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_410,(TextureFormat *)&rnd,renderedFrame.m_width,
                   renderedFrame.m_height,1,pvVar22);
        tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_410,iVar14,y,width,
                          height);
        rnd.m_rnd.x = 8;
        rnd.m_rnd.y = 3;
        pvVar22 = (void *)referenceFrame.m_pixels.m_cap;
        if (referenceFrame.m_pixels.m_cap != 0) {
          pvVar22 = referenceFrame.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_3a8,(TextureFormat *)&rnd,referenceFrame.m_width,
                   referenceFrame.m_height,1,pvVar22);
        tcu::getSubregion((PixelBufferAccess *)local_450,(PixelBufferAccess *)local_3a8,iVar14,y,
                          width,height);
        rnd.m_rnd.x = 8;
        rnd.m_rnd.y = 3;
        pvVar22 = (void *)errorMask.m_pixels.m_cap;
        if (errorMask.m_pixels.m_cap != 0) {
          pvVar22 = errorMask.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,(TextureFormat *)&rnd,errorMask.m_width,errorMask.m_height,1,pvVar22);
        tcu::getSubregion((PixelBufferAccess *)local_3d0,&local_58,iVar14,y,width,height);
        pTVar4 = this->m_texture;
        pCVar5 = (pTVar4->m_refTexture).m_view.m_levels[5];
        auStack_2e4._12_4_ = SUB84(pCVar5,0);
        auStack_2e4._16_4_ = (undefined4)((ulong)pCVar5 >> 0x20);
        rnd.m_rnd.x = (pTVar4->m_refTexture).m_view.m_numLevels;
        rnd.m_rnd.y = *(deUint32 *)&(pTVar4->m_refTexture).m_view.field_0x4;
        pCVar5 = (pTVar4->m_refTexture).m_view.m_levels[0];
        pCVar9 = (pTVar4->m_refTexture).m_view.m_levels[1];
        pCVar10 = (pTVar4->m_refTexture).m_view.m_levels[2];
        pCVar11 = (pTVar4->m_refTexture).m_view.m_levels[3];
        pCVar12 = (pTVar4->m_refTexture).m_view.m_levels[4];
        fStack_2e8 = SUB84(pCVar11,0);
        auStack_2e4._0_4_ = (undefined4)((ulong)pCVar11 >> 0x20);
        auStack_2e4._4_4_ = SUB84(pCVar12,0);
        auStack_2e4._8_4_ = (undefined4)((ulong)pCVar12 >> 0x20);
        aStack_2f8._M_allocated_capacity._0_4_ = SUB84(pCVar9,0);
        aStack_2f8._M_allocated_capacity._4_4_ = (undefined4)((ulong)pCVar9 >> 0x20);
        aStack_2f8._8_4_ = SUB84(pCVar10,0);
        aStack_2f8._12_4_ = (undefined4)((ulong)pCVar10 >> 0x20);
        rnd.m_rnd.z = (deUint32)pCVar5;
        rnd.m_rnd.w = (deUint32)((ulong)pCVar5 >> 0x20);
        iVar14 = glu::TextureTestUtil::computeTextureLookupDiff
                           ((ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)local_450,
                            (PixelBufferAccess *)local_3d0,(TextureCubeView *)&rnd,
                            texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,&local_ec,&local_338,&lodPrec,
                            ((this->super_TestCase).super_TestNode.m_testCtx)->m_watchDog);
        iVar16 = iVar16 + iVar14;
        uVar20 = uVar20 + 1;
        lVar21 = lVar21 + 0x10;
      } while ((long)uVar20 <
               (long)(int)((ulong)((long)gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)gridLayout.
                                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
      if (iVar16 < 1) {
        bVar13 = false;
      }
      else {
        rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        this_00 = &rnd.m_rnd.z;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<(this_00,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        std::ios_base::~ios_base(local_290);
        iVar16 = 1;
        bVar13 = true;
      }
    }
    pTVar6 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_410._0_8_ = (long)local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Result","");
    local_450._0_8_ = (long)local_450 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Verification result","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_410,(string *)local_450);
    tcu::TestLog::startImageSet(pTVar6,(char *)CONCAT44(res.m_data[1],res.m_data[0]),local_168._M_p)
    ;
    local_3a8._0_8_ = (long)local_3a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Rendered","");
    local_3d0._0_8_ = (long)local_3d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Rendered image","");
    pSVar19 = &renderedFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,(string *)local_3a8,(string *)local_3d0,pSVar19,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&rnd,(int)pTVar6,__buf,(size_t)pSVar19);
    if ((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8) != auStack_2e4 + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8),
                      CONCAT44(auStack_2e4._16_4_,auStack_2e4._12_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != &aStack_2f8) {
      operator_delete((void *)rnd.m_rnd._0_8_,
                      CONCAT44(aStack_2f8._M_allocated_capacity._4_4_,
                               aStack_2f8._M_allocated_capacity._0_4_) + 1);
    }
    if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != local_158) {
      operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_178) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(res.m_data[1],res.m_data[0]),local_178._M_allocated_capacity + 1);
    }
    if (local_450._0_8_ != (long)local_450 + 0x10) {
      operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
    }
    if (local_410._0_8_ != (long)local_410 + 0x10) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if (bVar13) {
      pTVar6 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      local_410._0_8_ = (long)local_410 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Reference","");
      local_450._0_8_ = (long)local_450 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Ideal reference","");
      pSVar19 = &referenceFrame;
      tcu::LogImage::LogImage
                ((LogImage *)&rnd,(string *)local_410,(string *)local_450,pSVar19,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar14 = (int)pTVar6;
      tcu::LogImage::write((LogImage *)&rnd,iVar14,__buf_00,(size_t)pSVar19);
      local_3a8._0_8_ = (long)local_3a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"ErrorMask","");
      local_3d0._0_8_ = (long)local_3d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Error mask","");
      pSVar19 = &errorMask;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)local_3a8,(string *)local_3d0,pSVar19,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,iVar14,__buf_01,(size_t)pSVar19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != local_158) {
        operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_178) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(res.m_data[1],res.m_data[0]),local_178._M_allocated_capacity + 1
                       );
      }
      if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      }
      if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
      if ((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8) != auStack_2e4 + 0xc) {
        operator_delete((undefined1 *)CONCAT44(auStack_2e4._0_4_,fStack_2e8),
                        CONCAT44(auStack_2e4._16_4_,auStack_2e4._12_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rnd.m_rnd._0_8_ != &aStack_2f8) {
        operator_delete((void *)rnd.m_rnd._0_8_,
                        CONCAT44(aStack_2f8._M_allocated_capacity._4_4_,
                                 aStack_2f8._M_allocated_capacity._0_4_) + 1);
      }
      if (local_450._0_8_ != (long)local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      if (local_410._0_8_ != (long)local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
    }
    tcu::TestLog::endImageSet(((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
    description = "Pass";
    if (iVar16 != 0) {
      description = "Image verification failed";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(iVar16 != 0),description);
    tcu::Surface::~Surface(&errorMask);
    tcu::Surface::~Surface(&referenceFrame);
    if (gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(gridLayout.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)gridLayout.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&renderedFrame);
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
             ,0x259);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	const deUint32			magFilter			= GL_NEAREST;
	const int				texWidth			= m_texture->getRefTexture().getSize();
	const int				texHeight			= m_texture->getRefTexture().getSize();
	const int				defViewportWidth	= texWidth*2;
	const int				defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const RandomViewport	viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));

	const bool				isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool				useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	vector<float>			texCoord;
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		RenderParams		params		(TEXTURETYPE_CUBE);

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Render reference and compare
	{
		tcu::Surface			referenceFrame		(viewport.width, viewport.height);
		tcu::Surface			errorMask			(viewport.width, viewport.height);
		int						numFailedPixels		= 0;
		ReferenceParams			params				(TEXTURETYPE_CUBE);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_OPENGL);

		// Params for rendering reference
		params.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
		params.sampler.seamlessCubeMap	= false;
		params.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask			= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		lookupPrec.colorThreshold		= tcu::computeFixedPointThreshold(max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0)));
		lookupPrec.coordBits			= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits				= tcu::IVec3(5,5,0);
		lodPrec.derivateBits			= 10;
		lodPrec.lodBits					= isProjected ? 4 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				params.flags	|= ReferenceParams::PROJECTED;
				params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				params.flags	|= ReferenceParams::USE_BIAS;
				params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getRefTexture(), &texCoord[0], params,
														lookupPrec, lodPrec, m_testCtx.getWatchDog());
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
						   << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
							   << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}